

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_is_a(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_BOOL *it_is)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  long lVar3;
  
  *it_is = 0;
  if (((-1 < node) && (pRVar1 = ref_geom->ref_adj, node < pRVar1->nnode)) &&
     (lVar3 = (long)pRVar1->first[(uint)node], lVar3 != -1)) {
    if (ref_geom->descr[(long)pRVar1->item[lVar3].ref * 6] != type) {
      pRVar2 = ref_geom->ref_adj->item;
      do {
        lVar3 = (long)pRVar2[(int)lVar3].next;
        if (lVar3 == -1) {
          return 0;
        }
      } while (ref_geom->descr[(long)pRVar2[lVar3].ref * 6] != type);
    }
    *it_is = 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_is_a(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_BOOL *it_is) {
  REF_INT item, geom;
  *it_is = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      *it_is = REF_TRUE;
      return REF_SUCCESS;
    }
  }
  return REF_SUCCESS;
}